

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void MD5Update(MD5_CTX *context,uchar *input,uint inputlen)

{
  uint local_24;
  uint partlen;
  uint index;
  uint i;
  uint inputlen_local;
  uchar *input_local;
  MD5_CTX *context_local;
  
  local_24 = context->count[0] >> 3 & 0x3f;
  partlen = 0x40 - local_24;
  context->count[0] = inputlen * 8 + context->count[0];
  if (context->count[0] < inputlen << 3) {
    context->count[1] = context->count[1] + 1;
  }
  context->count[1] = (inputlen >> 0x1d) + context->count[1];
  if (inputlen < partlen) {
    partlen = 0;
  }
  else {
    memcpy(context->buffer + local_24,input,(ulong)partlen);
    MD5Transform(context->state,context->buffer);
    for (; partlen + 0x40 <= inputlen; partlen = partlen + 0x40) {
      MD5Transform(context->state,input + partlen);
    }
    local_24 = 0;
  }
  memcpy(context->buffer + local_24,input + partlen,(ulong)(inputlen - partlen));
  return;
}

Assistant:

void MD5Update(MD5_CTX *context, unsigned char *input, unsigned int inputlen)
{
    unsigned int i = 0;
    unsigned int index = 0;
    unsigned int partlen = 0;

    index = (context->count[0] >> 3) & 0x3F;
    partlen = 64 - index;
    context->count[0] += inputlen << 3;

    if(context->count[0] < (inputlen << 3))
        context->count[1]++;
    context->count[1] += inputlen >> 29;

    if(inputlen >= partlen)
    {
        memcpy(&context->buffer[index], input,partlen);
        MD5Transform(context->state, context->buffer);

        for(i = partlen; i+64 <= inputlen; i+=64)
            MD5Transform(context->state, &input[i]);

        index = 0;        
    }  
    else
    {
        i = 0;
    }
    memcpy(&context->buffer[index], &input[i], inputlen-i);
}